

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist_tests.cpp
# Opt level: O3

void __thiscall skiplist_tests::getlocator_test::test_method(getlocator_test *this)

{
  uint256 *puVar1;
  uchar *puVar2;
  undefined8 uVar3;
  int i;
  undefined8 *__s;
  long *__s_00;
  void *__s_01;
  void *__s_02;
  base_uint<256U> *pbVar4;
  long lVar5;
  long *plVar6;
  uint64_t uVar7;
  uint uVar8;
  ulong uVar9;
  uint32_t *puVar10;
  long lVar11;
  int iVar12;
  char *pcVar13;
  CBlockIndex *pCVar14;
  iterator in_R8;
  iterator pvVar15;
  iterator in_R9;
  iterator pvVar16;
  uint32_t uVar17;
  int iVar18;
  undefined8 *puVar19;
  long lVar20;
  long in_FS_OFFSET;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  check_type cVar26;
  ulong local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  uint dist;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  CBlockLocator locator;
  CChain chain;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  undefined1 local_110 [8];
  undefined1 local_108 [8];
  undefined1 auStack_100 [16];
  assertion_result aStack_f0;
  undefined1 local_d8 [8];
  shared_ptr<boost::basic_wrap_stringstream<char>_> sStack_d0;
  uint32_t auStack_c0 [2];
  undefined1 local_b8 [16];
  uint32_t local_a8 [2];
  uint32_t auStack_a0 [2];
  undefined1 local_98 [8];
  shared_ptr<boost::basic_wrap_stringstream<char>_> sStack_90;
  pointer puStack_80;
  undefined1 local_78 [20];
  uint32_t uStack_64;
  pointer puStack_60;
  undefined1 local_58 [8];
  bool bStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  uchar uStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  uchar uStack_49;
  uint32_t local_48;
  uint32_t uStack_44;
  pointer puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __s = (undefined8 *)operator_new(3200000);
  memset(__s,0,3200000);
  __s_00 = (long *)operator_new(15200000);
  memset(__s_00,0,15200000);
  pcVar13 = (char *)0x0;
  uVar17 = 0;
  puVar19 = __s;
  do {
    uStack_64 = 0;
    puStack_60 = (pointer)0x0;
    local_78._4_4_ = 0;
    local_78._8_4_ = 0;
    local_78._12_4_ = 0;
    local_78._16_4_ = 0;
    local_78._0_4_ = uVar17;
    ArithToUint256((uint256 *)local_58,(arith_uint256 *)local_78);
    puVar19[2] = CONCAT44(uStack_44,local_48);
    puVar19[3] = puStack_40;
    *puVar19 = CONCAT17(local_58[7],
                        CONCAT16(local_58[6],
                                 CONCAT15(local_58[5],
                                          CONCAT14(local_58[4],
                                                   CONCAT13(local_58[3],
                                                            CONCAT12(local_58[2],
                                                                     CONCAT11(local_58[1],
                                                                              local_58[0])))))));
    puVar19[1] = CONCAT17(uStack_49,
                          CONCAT16(uStack_4a,
                                   CONCAT15(uStack_4b,
                                            CONCAT14(uStack_4c,
                                                     CONCAT13(uStack_4d,
                                                              CONCAT12(uStack_4e,
                                                                       CONCAT11(uStack_4f,bStack_50)
                                                                      ))))));
    *(uint32_t *)((long)__s_00 + (long)(pcVar13 + 0x18)) = uVar17;
    plVar6 = __s_00 + (ulong)(uVar17 - 1) * 0x13;
    if (pcVar13 == (char *)0x0) {
      plVar6 = (long *)0x0;
    }
    *(long **)((long)__s_00 + (long)(pcVar13 + 8)) = plVar6;
    *(undefined8 **)((long)__s_00 + (long)pcVar13) = puVar19;
    CBlockIndex::BuildSkip((CBlockIndex *)((long)__s_00 + (long)pcVar13));
    local_120 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_118 = "";
    local_130 = &boost::unit_test::basic_cstring<char_const>::null;
    local_128 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x39;
    file.m_begin = (iterator)&local_120;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_130,msg);
    sStack_90.px = (element_type *)(sStack_90._1_8_ << 8);
    local_98 = (undefined1  [8])&PTR__lazy_ostream_013ae088;
    sStack_90.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    puStack_80 = (pointer)0xf73bdc;
    puVar1 = ((CBlockIndex *)((long)__s_00 + (long)pcVar13))->phashBlock;
    if (puVar1 == (uint256 *)0x0) goto LAB_0062faf1;
    local_d8 = *(undefined1 (*) [8])(puVar1->super_base_blob<256U>).m_data._M_elems;
    sStack_d0 = *(shared_ptr<boost::basic_wrap_stringstream<char>_> *)
                 ((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
    auStack_c0 = *(uint32_t (*) [2])((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
    UintToArith256((arith_uint256 *)local_b8,(uint256 *)local_d8);
    puVar10 = (uint32_t *)((long)__s_00 + (long)(pcVar13 + 0x18));
    local_108._0_4_ = local_b8._0_4_;
    aStack_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(*puVar10 == local_b8._0_4_);
    aStack_f0.m_message.px = (element_type *)0x0;
    aStack_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    chain.vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xf44e94;
    chain.vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    bStack_50 = false;
    local_58[0] = 'H';
    local_58[1] = 0xe2;
    local_58[2] = ':';
    local_58[3] = '\x01';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_48 = 0x13c2138;
    uStack_44 = 0;
    puStack_40 = (pointer)&locator;
    local_78._8_4_ = local_78._8_4_ & 0xffffff00;
    local_78._0_4_ = 0x13ae248;
    local_78._4_4_ = 0;
    local_78._16_4_ = 0x13c2138;
    uStack_64 = 0;
    puStack_60 = (pointer)auStack_100;
    pvVar15 = (iterator)0x1;
    pvVar16 = (iterator)0x2;
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_108;
    auStack_100._0_8_ = puVar10;
    boost::test_tools::tt_detail::report_assertion
              (&aStack_f0,(lazy_ostream *)local_98,1,2,REQUIRE,0xf44faf,(size_t)&chain,0x39,local_58
               ,"vBlocksMain[i].nHeight",local_78);
    boost::detail::shared_count::~shared_count(&aStack_f0.m_message.pn);
    local_140 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_138 = "";
    local_150 = &boost::unit_test::basic_cstring<char_const>::null;
    local_148 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar26 = 0x62ecb4;
    file_00.m_end = (iterator)0x3a;
    file_00.m_begin = (iterator)&local_140;
    msg_00.m_end = pvVar16;
    msg_00.m_begin = pvVar15;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_150,
               msg_00);
    if (*(long *)((long)__s_00 + (long)(pcVar13 + 8)) == 0) {
      bVar21 = true;
    }
    else {
      bVar21 = *puVar10 == *(int *)(*(long *)((long)__s_00 + (long)(pcVar13 + 8)) + 0x18) + 1U;
    }
    local_78[0] = bVar21;
    local_78._8_4_ = 0;
    local_78._12_4_ = 0;
    local_78._16_4_ = 0;
    uStack_64 = 0;
    local_98 = (undefined1  [8])0xf45004;
    sStack_90.px = (element_type *)0xf45062;
    bStack_50 = false;
    local_58[0] = 200;
    local_58[1] = 0xe1;
    local_58[2] = ':';
    local_58[3] = '\x01';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_48 = 0x13c2138;
    uStack_44 = 0;
    puStack_40 = (pointer)local_98;
    local_160 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_158 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_78,(lazy_ostream *)local_58,1,0,WARN,_cVar26,
               (size_t)&local_160,0x3a);
    boost::detail::shared_count::~shared_count((shared_count *)(local_78 + 0x10));
    uVar17 = uVar17 + 1;
    pcVar13 = pcVar13 + 0x98;
    puVar19 = puVar19 + 4;
  } while (pcVar13 !=
           "12d24c0178126fdd334964a54b8353482a83be17cf2ee52d23b72e5f57fe31eebf8a1a64742eb9459bcb0eca231a1658ab88b7056d8e47554f0a46058d6565c6cbf6edec45fdde6f051e38255b82493de27ffd3efbe1b179b9642d2166073db6d4832707420237a00bad7125795e645e5bc3e1431ecbabf0ff5f74416626322545c966241cce6d8f2c035a78f100e030741f13b02a9eaf618d468bc40274db98bc342be12ad4d892c2ba546e571c556ac7cbf4e4c3fd3431efd40457cf65a297845dd8cce09811418c3cef941ff32c43c375157f6f49c2e893625e4b216b1f985aa0fd25f29a9011d4f59c78b037ed71f384e5de8116e3fc148c0a3cad07cb119b9829aac55eed9a299edb9abc5d017be485f690add70ff2efbb889ac6ce0da9b3bdbeb9dd47823116733d58a8d510b7f2e2c8244a2cbf53816b59e413207fb75f9c5ce1af06e67d182d3250ea3283bcbb45cb07ea6a6aa486361eb6f69199c0eb8e6490beff82e4ab274b1204e7f2f0ba097fba0332aa4c4a861771f5b3d45ce43e667581a40fee4bebe7fa9d87b70a5bb876c928f7e6d16ae604b3a4e9c7f1d616e2deab96b6207705b9a8f87468503cdd20a3c02cc8da43d046da68b5ed163d926a5a714a4df1b8ef007bca408f68b9e20de86d6398ad81df5e74d5aaac40874b5d6787211ff88e128cf1676e84ca7f51aee5951efee1915dcc11502a8df74fac4c8451dda49b631a8fb87470f0ebe9b67449bbd1640ceee6101e8cd82aa1033fa84f75b28450e461b93f65da5c43759b0e83660d50961702bb1ad015dad42e600117475237cf6e7279d4a02d1f67cf59de0108355d03963e3d84ce7647173dd7d77a6b3f275d7de74236d7bbb2df437d536136dbe1dbe8f307facc7bc7d0cde1abf745cbeb81af1ab2c46138cf007e901f22668377958bcbbadb7e9905973b27ff0c5baaece25e974c1bd116cc81dd1c81a30bae86a6fb12c6a5494068e122153128313eb3e628d76e9babc823c9eb9d3b81bacfa7a6b372abe6b1246a350f23e2e95b09c9037a75aac255ef7d4f267cad3ce869531b4165db2e5a9792094efea4ae3d9ea4d0efdc712e63df21882a353743190e016b2166e4da8a2c78e48defc7155d5fdfc4e596624e6a19c91b43719a22c1204b1cefe05989d455773d3881fa8d3eefc255f81dfe90bd41dc6f1e9c265a753298a6e98c999acd9525a9db5f9f9456a0f51a93dd9693e1d9c3fa283f7c58a9c752afcaa635abea8dfc80e2c326b939260069457fdad68c341852dcb5fcbbd351318defd7ae3b9f827478eb77306a5ae14cf8895f2bc6f0f361ffc8aa37e286629dc7e59b73a8712525e851c64d363065631edc1609f3d49a09575876a"
          );
  __s_01 = operator_new(1600000);
  memset(__s_01,0,1600000);
  __s_02 = operator_new(7600000);
  memset(__s_02,0,7600000);
  lVar20 = 0;
  do {
    bStack_50 = false;
    uStack_4f = '\0';
    uStack_4e = '\0';
    uStack_4d = '\0';
    uStack_4c = '\0';
    uStack_4b = '\0';
    uStack_4a = '\0';
    uStack_49 = '\0';
    local_48 = 0;
    uStack_44 = 0;
    puStack_40 = (pointer)0x0;
    local_58[0] = '\x01';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    pbVar4 = base_uint<256U>::operator<<=((base_uint<256U> *)local_58,0x80);
    local_a8 = (uint32_t  [2])*(undefined8 *)(pbVar4->pn + 4);
    auStack_a0 = (uint32_t  [2])*(undefined8 *)(pbVar4->pn + 6);
    local_b8._0_8_ = *(uint **)pbVar4->pn;
    local_b8._8_8_ = *(char **)(pbVar4->pn + 2);
    iVar18 = (int)lVar20 + 50000;
    local_58[0] = (uchar)iVar18;
    local_58[1] = (uchar)((uint)iVar18 >> 8);
    local_58[2] = (uchar)((uint)iVar18 >> 0x10);
    local_58[3] = (uchar)((uint)iVar18 >> 0x18);
    uStack_44 = 0;
    puStack_40 = (pointer)0x0;
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    bStack_50 = false;
    uStack_4f = '\0';
    uStack_4e = '\0';
    uStack_4d = '\0';
    uStack_4c = '\0';
    uStack_4b = '\0';
    uStack_4a = '\0';
    uStack_49 = '\0';
    local_48 = 0;
    lVar5 = 0;
    uVar9 = 0;
    do {
      uVar9 = (ulong)*(uint *)(local_b8 + lVar5 * 4) + *(uint *)(local_58 + lVar5 * 4) + uVar9;
      *(int *)(local_58 + lVar5 * 4) = (int)uVar9;
      uVar9 = uVar9 >> 0x20;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 8);
    local_98 = (undefined1  [8])
               CONCAT17(local_58[7],
                        CONCAT16(local_58[6],
                                 CONCAT15(local_58[5],
                                          CONCAT14(local_58[4],
                                                   CONCAT13(local_58[3],
                                                            CONCAT12(local_58[2],
                                                                     CONCAT11(local_58[1],
                                                                              local_58[0])))))));
    sStack_90.px._1_1_ = uStack_4f;
    sStack_90.px._0_1_ = bStack_50;
    sStack_90.px._2_1_ = uStack_4e;
    sStack_90.px._3_1_ = uStack_4d;
    sStack_90.px._4_1_ = uStack_4c;
    sStack_90.px._5_1_ = uStack_4b;
    sStack_90.px._6_1_ = uStack_4a;
    sStack_90.px._7_1_ = uStack_49;
    sStack_90.pn.pi_._4_4_ = uStack_44;
    sStack_90.pn.pi_._0_4_ = local_48;
    puStack_80 = puStack_40;
    ArithToUint256((uint256 *)local_78,(arith_uint256 *)local_98);
    lVar5 = lVar20 * 0x20;
    puVar19 = (undefined8 *)((long)__s_01 + lVar5 + 0x10);
    *puVar19 = CONCAT44(uStack_64,local_78._16_4_);
    puVar19[1] = puStack_60;
    *(undefined8 *)((long)__s_01 + lVar5) = CONCAT44(local_78._4_4_,local_78._0_4_);
    ((undefined8 *)((long)__s_01 + lVar5))[1] = CONCAT44(local_78._12_4_,local_78._8_4_);
    lVar11 = lVar20 * 0x98;
    pCVar14 = (CBlockIndex *)((long)__s_02 + lVar11);
    *(int *)((long)__s_02 + lVar11 + 0x18) = iVar18;
    plVar6 = (long *)((ulong)((int)lVar20 - 1) * 0x98 + (long)__s_02);
    if (lVar20 == 0) {
      plVar6 = __s_00 + 0xe7edd;
    }
    *(long **)((long)__s_02 + lVar11 + 8) = plVar6;
    *(void **)((long)__s_02 + lVar11) = (void *)((long)__s_01 + lVar5);
    CBlockIndex::BuildSkip(pCVar14);
    local_170 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_168 = "";
    local_180 = &boost::unit_test::basic_cstring<char_const>::null;
    local_178 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x46;
    file_01.m_begin = (iterator)&local_170;
    msg_01.m_end = in_R9;
    msg_01.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_180,
               msg_01);
    sStack_90.px = (element_type *)(sStack_90._1_8_ << 8);
    local_98 = (undefined1  [8])&PTR__lazy_ostream_013ae088;
    sStack_90.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    puStack_80 = (pointer)0xf73bdc;
    puVar1 = pCVar14->phashBlock;
    if (puVar1 == (uint256 *)0x0) goto LAB_0062faf1;
    local_d8 = *(undefined1 (*) [8])(puVar1->super_base_blob<256U>).m_data._M_elems;
    sStack_d0 = *(shared_ptr<boost::basic_wrap_stringstream<char>_> *)
                 ((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
    auStack_c0 = *(uint32_t (*) [2])((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
    UintToArith256((arith_uint256 *)local_b8,(uint256 *)local_d8);
    puVar10 = (uint32_t *)((long)__s_02 + lVar11 + 0x18);
    local_108._0_4_ = local_b8._0_4_;
    aStack_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(*puVar10 == local_b8._0_4_);
    aStack_f0.m_message.px = (element_type *)0x0;
    aStack_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    chain.vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xf44e94;
    chain.vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    bStack_50 = false;
    local_58[0] = 'H';
    local_58[1] = 0xe2;
    local_58[2] = ':';
    local_58[3] = '\x01';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_48 = 0x13c2138;
    uStack_44 = 0;
    puStack_40 = (pointer)&locator;
    local_78._8_4_ = local_78._8_4_ & 0xffffff00;
    local_78._0_4_ = 0x13ae248;
    local_78._4_4_ = 0;
    local_78._16_4_ = 0x13c2138;
    uStack_64 = 0;
    puStack_60 = (pointer)auStack_100;
    pvVar15 = (iterator)0x1;
    pvVar16 = (iterator)0x2;
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_108;
    auStack_100._0_8_ = puVar10;
    boost::test_tools::tt_detail::report_assertion
              (&aStack_f0,(lazy_ostream *)local_98,1,2,REQUIRE,0xf45063,(size_t)&chain,0x46,local_58
               ,"vBlocksSide[i].nHeight",local_78);
    boost::detail::shared_count::~shared_count(&aStack_f0.m_message.pn);
    local_190 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_188 = "";
    local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_198 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar26 = 0x62f186;
    file_02.m_end = (iterator)0x47;
    file_02.m_begin = (iterator)&local_190;
    msg_02.m_end = pvVar16;
    msg_02.m_begin = pvVar15;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1a0,
               msg_02);
    if (pCVar14->pprev == (CBlockIndex *)0x0) {
      bVar21 = true;
    }
    else {
      bVar21 = *puVar10 == pCVar14->pprev->nHeight + 1U;
    }
    local_78[0] = bVar21;
    local_78._8_4_ = 0;
    local_78._12_4_ = 0;
    local_78._16_4_ = 0;
    uStack_64 = 0;
    local_98 = (undefined1  [8])0xf450b8;
    sStack_90.px = (element_type *)0xf45116;
    bStack_50 = false;
    local_58[0] = 200;
    local_58[1] = 0xe1;
    local_58[2] = ':';
    local_58[3] = '\x01';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_48 = 0x13c2138;
    uStack_44 = 0;
    puStack_40 = (pointer)local_98;
    local_1b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_1a8 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_78,(lazy_ostream *)local_58,1,0,WARN,_cVar26,
               (size_t)&local_1b0,0x47);
    boost::detail::shared_count::~shared_count((shared_count *)(local_78 + 0x10));
    lVar20 = lVar20 + 1;
  } while (lVar20 != 50000);
  chain.vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  chain.vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  chain.vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CChain::SetTip(&chain,(CBlockIndex *)(__s_00 + 0x1cfdcd));
  iVar18 = 0;
  while( true ) {
    do {
      uVar7 = RandomMixin<FastRandomContext>::randbits
                        (&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng.
                          super_RandomMixin<FastRandomContext>,0x12);
    } while (149999 < uVar7);
    pCVar14 = (CBlockIndex *)((ulong)((int)uVar7 - 100000) * 0x98 + (long)__s_02);
    if (uVar7 < 100000) {
      pCVar14 = (CBlockIndex *)(__s_00 + uVar7 * 0x13);
    }
    GetLocator(&locator,pCVar14);
    local_1f0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_1e8 = "";
    local_200 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar26 = 0x62f36c;
    file_03.m_end = (iterator)0x55;
    file_03.m_begin = (iterator)&local_1f0;
    msg_03.m_end = in_R9;
    msg_03.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_200,
               msg_03);
    puVar1 = pCVar14->phashBlock;
    if (puVar1 == (uint256 *)0x0) break;
    local_58[0] = (puVar1->super_base_blob<256U>).m_data._M_elems[0];
    local_58[1] = (puVar1->super_base_blob<256U>).m_data._M_elems[1];
    local_58[2] = (puVar1->super_base_blob<256U>).m_data._M_elems[2];
    local_58[3] = (puVar1->super_base_blob<256U>).m_data._M_elems[3];
    local_58[4] = (puVar1->super_base_blob<256U>).m_data._M_elems[4];
    local_58[5] = (puVar1->super_base_blob<256U>).m_data._M_elems[5];
    local_58[6] = (puVar1->super_base_blob<256U>).m_data._M_elems[6];
    local_58[7] = (puVar1->super_base_blob<256U>).m_data._M_elems[7];
    bStack_50 = (bool)(puVar1->super_base_blob<256U>).m_data._M_elems[8];
    uStack_4f = (puVar1->super_base_blob<256U>).m_data._M_elems[9];
    uStack_4e = (puVar1->super_base_blob<256U>).m_data._M_elems[10];
    uStack_4d = (puVar1->super_base_blob<256U>).m_data._M_elems[0xb];
    uStack_4c = (puVar1->super_base_blob<256U>).m_data._M_elems[0xc];
    uStack_4b = (puVar1->super_base_blob<256U>).m_data._M_elems[0xd];
    uStack_4a = (puVar1->super_base_blob<256U>).m_data._M_elems[0xe];
    uStack_49 = (puVar1->super_base_blob<256U>).m_data._M_elems[0xf];
    auVar22 = *(undefined1 (*) [16])((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
    local_48 = auVar22._0_4_;
    uStack_44 = auVar22._4_4_;
    puStack_40 = auVar22._8_8_;
    auVar24[0] = -(((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems[0x10]
                  == auVar22[0]);
    auVar24[1] = -(((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems[0x11]
                  == auVar22[1]);
    auVar24[2] = -(((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems[0x12]
                  == auVar22[2]);
    auVar24[3] = -(((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems[0x13]
                  == auVar22[3]);
    auVar24[4] = -(((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems[0x14]
                  == auVar22[4]);
    auVar24[5] = -(((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems[0x15]
                  == auVar22[5]);
    auVar24[6] = -(((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems[0x16]
                  == auVar22[6]);
    auVar24[7] = -(((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems[0x17]
                  == auVar22[7]);
    auVar24[8] = -(((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems[0x18]
                  == auVar22[8]);
    auVar24[9] = -(((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems[0x19]
                  == auVar22[9]);
    auVar24[10] = -(((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems
                    [0x1a] == auVar22[10]);
    auVar24[0xb] = -(((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems
                     [0x1b] == auVar22[0xb]);
    auVar24[0xc] = -(((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems
                     [0x1c] == auVar22[0xc]);
    auVar24[0xd] = -(((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems
                     [0x1d] == auVar22[0xd]);
    auVar24[0xe] = -(((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems
                     [0x1e] == auVar22[0xe]);
    auVar24[0xf] = -(((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems
                     [0x1f] == auVar22[0xf]);
    auVar22[0] = -(((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems[0] ==
                  local_58[0]);
    auVar22[1] = -(((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems[1] ==
                  local_58[1]);
    auVar22[2] = -(((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems[2] ==
                  local_58[2]);
    auVar22[3] = -(((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems[3] ==
                  local_58[3]);
    auVar22[4] = -(((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems[4] ==
                  local_58[4]);
    auVar22[5] = -(((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems[5] ==
                  local_58[5]);
    auVar22[6] = -(((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems[6] ==
                  local_58[6]);
    auVar22[7] = -(((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems[7] ==
                  local_58[7]);
    auVar22[8] = -((bool)((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                           _M_impl.super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data.
                         _M_elems[8] == bStack_50);
    auVar22[9] = -(((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems[9] ==
                  uStack_4f);
    auVar22[10] = -(((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems[10]
                   == uStack_4e);
    auVar22[0xb] = -(((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems
                     [0xb] == uStack_4d);
    auVar22[0xc] = -(((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems
                     [0xc] == uStack_4c);
    auVar22[0xd] = -(((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems
                     [0xd] == uStack_4b);
    auVar22[0xe] = -(((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems
                     [0xe] == uStack_4a);
    auVar22[0xf] = -(((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems
                     [0xf] == uStack_49);
    auVar22 = auVar22 & auVar24;
    local_98[0] = (ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) == 0xffff;
    sStack_90.px = (element_type *)0x0;
    sStack_90.pn.pi_ = (sp_counted_base *)0x0;
    local_b8._0_8_ = "locator.vHave.front() == tip->GetBlockHash()";
    local_b8._8_8_ = "";
    local_78._8_4_ = local_78._8_4_ & 0xffffff00;
    local_78._0_4_ = 0x13ae1c8;
    local_78._4_4_ = 0;
    local_78._16_4_ = 0x13c2138;
    uStack_64 = 0;
    puStack_60 = (pointer)local_b8;
    local_210 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_208 = "";
    pvVar15 = (iterator)0x1;
    pvVar16 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_98,(lazy_ostream *)local_78,1,0,WARN,_cVar26,
               (size_t)&local_210,0x55);
    boost::detail::shared_count::~shared_count(&sStack_90.pn);
    local_220 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_218 = "";
    local_230 = &boost::unit_test::basic_cstring<char_const>::null;
    local_228 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar26 = 0x62f4c1;
    file_04.m_end = (iterator)0x56;
    file_04.m_begin = (iterator)&local_220;
    msg_04.m_end = pvVar16;
    msg_04.m_begin = pvVar15;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_230,
               msg_04);
    puVar2 = (uchar *)*__s_00;
    if (puVar2 == (uchar *)0x0) break;
    local_58[0] = *puVar2;
    local_58[1] = puVar2[1];
    local_58[2] = puVar2[2];
    local_58[3] = puVar2[3];
    local_58[4] = puVar2[4];
    local_58[5] = puVar2[5];
    local_58[6] = puVar2[6];
    local_58[7] = puVar2[7];
    bStack_50 = (bool)puVar2[8];
    uStack_4f = puVar2[9];
    uStack_4e = puVar2[10];
    uStack_4d = puVar2[0xb];
    uStack_4c = puVar2[0xc];
    uStack_4b = puVar2[0xd];
    uStack_4a = puVar2[0xe];
    uStack_49 = puVar2[0xf];
    auVar22 = *(undefined1 (*) [16])(puVar2 + 0x10);
    local_48 = auVar22._0_4_;
    uStack_44 = auVar22._4_4_;
    puStack_40 = auVar22._8_8_;
    auVar25[0] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[0x10]
                  == auVar22[0]);
    auVar25[1] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[0x11]
                  == auVar22[1]);
    auVar25[2] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[0x12]
                  == auVar22[2]);
    auVar25[3] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[0x13]
                  == auVar22[3]);
    auVar25[4] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[0x14]
                  == auVar22[4]);
    auVar25[5] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[0x15]
                  == auVar22[5]);
    auVar25[6] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[0x16]
                  == auVar22[6]);
    auVar25[7] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[0x17]
                  == auVar22[7]);
    auVar25[8] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[0x18]
                  == auVar22[8]);
    auVar25[9] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[0x19]
                  == auVar22[9]);
    auVar25[10] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems
                    [0x1a] == auVar22[10]);
    auVar25[0xb] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems
                     [0x1b] == auVar22[0xb]);
    auVar25[0xc] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems
                     [0x1c] == auVar22[0xc]);
    auVar25[0xd] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems
                     [0x1d] == auVar22[0xd]);
    auVar25[0xe] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems
                     [0x1e] == auVar22[0xe]);
    auVar25[0xf] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems
                     [0x1f] == auVar22[0xf]);
    auVar23[0] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[0] ==
                  local_58[0]);
    auVar23[1] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[1] ==
                  local_58[1]);
    auVar23[2] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[2] ==
                  local_58[2]);
    auVar23[3] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[3] ==
                  local_58[3]);
    auVar23[4] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[4] ==
                  local_58[4]);
    auVar23[5] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[5] ==
                  local_58[5]);
    auVar23[6] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[6] ==
                  local_58[6]);
    auVar23[7] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[7] ==
                  local_58[7]);
    auVar23[8] = -((bool)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl
                         .super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data.
                         _M_elems[8] == bStack_50);
    auVar23[9] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[9] ==
                  uStack_4f);
    auVar23[10] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[10]
                   == uStack_4e);
    auVar23[0xb] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems
                     [0xb] == uStack_4d);
    auVar23[0xc] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems
                     [0xc] == uStack_4c);
    auVar23[0xd] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems
                     [0xd] == uStack_4b);
    auVar23[0xe] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems
                     [0xe] == uStack_4a);
    auVar23[0xf] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems
                     [0xf] == uStack_49);
    auVar23 = auVar23 & auVar25;
    local_98[0] = (ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) == 0xffff;
    sStack_90.px = (element_type *)0x0;
    sStack_90.pn.pi_ = (sp_counted_base *)0x0;
    local_b8._0_8_ = "locator.vHave.back() == vBlocksMain[0].GetBlockHash()";
    local_b8._8_8_ = "";
    local_78._8_4_ = local_78._8_4_ & 0xffffff00;
    local_78._0_4_ = 0x13ae1c8;
    local_78._4_4_ = 0;
    local_78._16_4_ = 0x13c2138;
    uStack_64 = 0;
    puStack_60 = (pointer)local_b8;
    local_240 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_238 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_98,(lazy_ostream *)local_78,1,0,WARN,_cVar26,
               (size_t)&local_240,0x56);
    boost::detail::shared_count::~shared_count(&sStack_90.pn);
    uVar9 = 1;
    iVar12 = -1;
    lVar20 = 0x20;
    do {
      lVar5 = (long)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start >> 5;
      if (lVar5 - 1U <= uVar9) goto LAB_0062f7fe;
      local_250 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
      ;
      local_248 = "";
      local_260 = &boost::unit_test::basic_cstring<char_const>::null;
      local_258 = &boost::unit_test::basic_cstring<char_const>::null;
      file_05.m_end = (iterator)0x5a;
      file_05.m_begin = (iterator)&local_250;
      msg_05.m_end = in_R9;
      msg_05.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_260,
                 msg_05);
      sStack_90.px = (element_type *)(sStack_90._1_8_ << 8);
      local_98 = (undefined1  [8])&PTR__lazy_ostream_013ae088;
      sStack_90.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      puStack_80 = (pointer)0xf73bdc;
      UintToArith256((arith_uint256 *)local_b8,
                     (uint256 *)
                     (((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems +
                     lVar20));
      local_110 = (undefined1  [8])local_b8._0_8_;
      uVar8 = pCVar14->nHeight + iVar12;
      local_290 = CONCAT44(local_290._4_4_,uVar8);
      local_d8[0] = (uint *)local_b8._0_8_ == (uint *)(ulong)uVar8;
      sStack_d0.px = (element_type *)0x0;
      sStack_d0.pn.pi_ = (sp_counted_base *)0x0;
      aStack_f0._0_8_ =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
      ;
      aStack_f0.m_message.px = (element_type *)0xf44e94;
      auStack_100._0_8_ = local_110;
      bStack_50 = false;
      local_58[0] = 200;
      local_58[1] = 0xe0;
      local_58[2] = ':';
      local_58[3] = '\x01';
      local_58[4] = '\0';
      local_58[5] = '\0';
      local_58[6] = '\0';
      local_58[7] = '\0';
      local_48 = 0x13c2138;
      uStack_44 = 0;
      puStack_40 = (pointer)auStack_100;
      local_108 = (undefined1  [8])&local_290;
      local_78._8_4_ = local_78._8_4_ & 0xffffff00;
      local_78._0_4_ = 0x13ae108;
      local_78._4_4_ = 0;
      local_78._16_4_ = 0x13c2138;
      uStack_64 = 0;
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0x2;
      puStack_60 = (pointer)local_108;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_d8,(lazy_ostream *)local_98,1,2,REQUIRE,0xf451bd,
                 (size_t)&aStack_f0,0x5a,local_58,"tip->nHeight - i",local_78);
      boost::detail::shared_count::~shared_count(&sStack_d0.pn);
      uVar9 = uVar9 + 1;
      iVar12 = iVar12 + -1;
      lVar20 = lVar20 + 0x20;
    } while (uVar9 != 0xc);
    lVar5 = (long)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_start >> 5;
LAB_0062f7fe:
    dist = 2;
    if (lVar5 - 0xeU < 0xfffffffffffffff3) {
      uVar9 = 0xc;
      uVar8 = 0xd;
      do {
        local_278 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
        ;
        local_270 = "";
        local_288 = &boost::unit_test::basic_cstring<char_const>::null;
        local_280 = &boost::unit_test::basic_cstring<char_const>::null;
        file_06.m_end = (iterator)0x60;
        file_06.m_begin = (iterator)&local_278;
        msg_06.m_end = in_R9;
        msg_06.m_begin = in_R8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_288
                   ,msg_06);
        sStack_90.px = (element_type *)(sStack_90._1_8_ << 8);
        local_98 = (undefined1  [8])&PTR__lazy_ostream_013ae088;
        sStack_90.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        puStack_80 = (pointer)0xf73bdc;
        UintToArith256((arith_uint256 *)local_b8,
                       locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_start + (uVar8 - 2));
        uVar3 = local_b8._0_8_;
        UintToArith256((arith_uint256 *)local_d8,
                       locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar9);
        local_290 = uVar3 - (long)local_d8;
        aStack_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(readonly_property<bool>)(local_290 == dist);
        aStack_f0.m_message.px = (element_type *)0x0;
        aStack_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
        auStack_100._0_8_ =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
        ;
        auStack_100._8_8_ = "";
        local_108 = (undefined1  [8])&local_290;
        bStack_50 = false;
        local_58[0] = 200;
        local_58[1] = 0xe0;
        local_58[2] = ':';
        local_58[3] = '\x01';
        local_58[4] = '\0';
        local_58[5] = '\0';
        local_58[6] = '\0';
        local_58[7] = '\0';
        local_48 = 0x13c2138;
        uStack_44 = 0;
        local_110 = (undefined1  [8])&dist;
        local_78._8_4_ = local_78._8_4_ & 0xffffff00;
        local_78._0_4_ = 0x13ae108;
        local_78._4_4_ = 0;
        local_78._16_4_ = 0x13c2138;
        uStack_64 = 0;
        puStack_60 = (pointer)local_110;
        in_R8 = (iterator)0x1;
        in_R9 = (iterator)0x2;
        puStack_40 = (pointer)local_108;
        boost::test_tools::tt_detail::report_assertion
                  (&aStack_f0,(lazy_ostream *)local_98,1,2,REQUIRE,0xf4518b,(size_t)auStack_100,0x60
                   ,local_58,"dist",local_78);
        boost::detail::shared_count::~shared_count(&aStack_f0.m_message.pn);
        dist = dist << 1;
        uVar9 = (ulong)uVar8;
        uVar8 = uVar8 + 1;
      } while (uVar9 < ((long)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 5) - 1U);
    }
    if (locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    iVar18 = iVar18 + 1;
    if (iVar18 == 100) {
      if (chain.vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(chain.vChain.
                        super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)chain.vChain.
                              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)chain.vChain.
                              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      operator_delete(__s_02,7600000);
      operator_delete(__s_01,1600000);
      operator_delete(__s_00,15200000);
      operator_delete(__s,3200000);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
  }
LAB_0062faf1:
  __assert_fail("phashBlock != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h",
                0xf5,"uint256 CBlockIndex::GetBlockHash() const");
}

Assistant:

BOOST_AUTO_TEST_CASE(getlocator_test)
{
    // Build a main chain 100000 blocks long.
    std::vector<uint256> vHashMain(100000);
    std::vector<CBlockIndex> vBlocksMain(100000);
    for (unsigned int i=0; i<vBlocksMain.size(); i++) {
        vHashMain[i] = ArithToUint256(i); // Set the hash equal to the height, so we can quickly check the distances.
        vBlocksMain[i].nHeight = i;
        vBlocksMain[i].pprev = i ? &vBlocksMain[i - 1] : nullptr;
        vBlocksMain[i].phashBlock = &vHashMain[i];
        vBlocksMain[i].BuildSkip();
        BOOST_CHECK_EQUAL((int)UintToArith256(vBlocksMain[i].GetBlockHash()).GetLow64(), vBlocksMain[i].nHeight);
        BOOST_CHECK(vBlocksMain[i].pprev == nullptr || vBlocksMain[i].nHeight == vBlocksMain[i].pprev->nHeight + 1);
    }

    // Build a branch that splits off at block 49999, 50000 blocks long.
    std::vector<uint256> vHashSide(50000);
    std::vector<CBlockIndex> vBlocksSide(50000);
    for (unsigned int i=0; i<vBlocksSide.size(); i++) {
        vHashSide[i] = ArithToUint256(i + 50000 + (arith_uint256(1) << 128)); // Add 1<<128 to the hashes, so GetLow64() still returns the height.
        vBlocksSide[i].nHeight = i + 50000;
        vBlocksSide[i].pprev = i ? &vBlocksSide[i - 1] : (vBlocksMain.data()+49999);
        vBlocksSide[i].phashBlock = &vHashSide[i];
        vBlocksSide[i].BuildSkip();
        BOOST_CHECK_EQUAL((int)UintToArith256(vBlocksSide[i].GetBlockHash()).GetLow64(), vBlocksSide[i].nHeight);
        BOOST_CHECK(vBlocksSide[i].pprev == nullptr || vBlocksSide[i].nHeight == vBlocksSide[i].pprev->nHeight + 1);
    }

    // Build a CChain for the main branch.
    CChain chain;
    chain.SetTip(vBlocksMain.back());

    // Test 100 random starting points for locators.
    for (int n=0; n<100; n++) {
        int r = m_rng.randrange(150000);
        CBlockIndex* tip = (r < 100000) ? &vBlocksMain[r] : &vBlocksSide[r - 100000];
        CBlockLocator locator = GetLocator(tip);

        // The first result must be the block itself, the last one must be genesis.
        BOOST_CHECK(locator.vHave.front() == tip->GetBlockHash());
        BOOST_CHECK(locator.vHave.back() == vBlocksMain[0].GetBlockHash());

        // Entries 1 through 11 (inclusive) go back one step each.
        for (unsigned int i = 1; i < 12 && i < locator.vHave.size() - 1; i++) {
            BOOST_CHECK_EQUAL(UintToArith256(locator.vHave[i]).GetLow64(), tip->nHeight - i);
        }

        // The further ones (excluding the last one) go back with exponential steps.
        unsigned int dist = 2;
        for (unsigned int i = 12; i < locator.vHave.size() - 1; i++) {
            BOOST_CHECK_EQUAL(UintToArith256(locator.vHave[i - 1]).GetLow64() - UintToArith256(locator.vHave[i]).GetLow64(), dist);
            dist *= 2;
        }
    }
}